

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O2

double libcalc::eval(string *expr)

{
  Tokenizer *this;
  string local_40;
  double local_20;
  
  this = (Tokenizer *)operator_new(0x18);
  std::__cxx11::string::string((string *)&local_40,(string *)expr);
  Tokenizer::Tokenizer(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_20 = Tokenizer::evaluate(this);
  Tokenizer::~Tokenizer(this);
  operator_delete(this);
  return local_20;
}

Assistant:

double eval(std::string expr) {
  double result = 0;

  Tokenizer *t = new Tokenizer(expr);
  result = t->evaluate();
  delete t;

  return result;
}